

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O2

bool __thiscall
OSSLEVPSymmetricAlgorithm::decryptUpdate
          (OSSLEVPSymmetricAlgorithm *this,ByteString *encryptedData,ByteString *data)

{
  unsigned_long *puVar1;
  BIGNUM *a;
  EVP_CIPHER_CTX *ctx;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  size_t sVar5;
  uchar *out;
  uchar *in;
  ulong e;
  char *pcVar6;
  int outLen;
  ByteString dummy;
  
  bVar2 = SymmetricAlgorithm::decryptUpdate(&this->super_SymmetricAlgorithm,encryptedData,data);
  if (bVar2) {
    if ((this->super_SymmetricAlgorithm).currentCipherMode == GCM) {
      ByteString::resize(data,0);
      bVar2 = true;
    }
    else {
      if (this->maximumBytes != (BIGNUM *)0x0) {
        a = (BIGNUM *)this->counterBytes;
        sVar4 = ByteString::size(encryptedData);
        BN_add_word(a,sVar4);
      }
      sVar4 = ByteString::size(encryptedData);
      iVar3 = (*(this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm[0xd])(this);
      ByteString::resize(data,sVar4 + CONCAT44(extraout_var,iVar3));
      sVar4 = ByteString::size(data);
      outLen = (int)sVar4;
      sVar4 = ByteString::size(encryptedData);
      sVar5 = ByteString::size(data);
      softHSMLog(7,"decryptUpdate",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x1b4,"Decrypting %d bytes into buffer of %d bytes",sVar4,sVar5);
      ctx = (EVP_CIPHER_CTX *)this->pCurCTX;
      out = ByteString::operator[](data,0);
      in = ByteString::const_byte_str(encryptedData);
      sVar4 = ByteString::size(encryptedData);
      iVar3 = EVP_DecryptUpdate(ctx,out,&outLen,in,(int)sVar4);
      bVar2 = iVar3 != 0;
      if (iVar3 == 0) {
        e = ERR_get_error();
        pcVar6 = ERR_error_string(e,(char *)0x0);
        softHSMLog(3,"decryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0x1b8,"EVP_DecryptUpdate failed: %s",pcVar6);
        clean(this);
        ByteString::ByteString(&dummy);
        SymmetricAlgorithm::decryptFinal(&this->super_SymmetricAlgorithm,&dummy);
        ByteString::~ByteString(&dummy);
      }
      else {
        softHSMLog(7,"decryptUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                   ,0x1c2,"Decrypt returned %d bytes of data",(ulong)(uint)outLen);
        ByteString::resize(data,(long)outLen);
        puVar1 = &(this->super_SymmetricAlgorithm).currentBufferSize;
        *puVar1 = *puVar1 - (long)outLen;
      }
    }
  }
  else {
    clean(this);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::decryptUpdate(const ByteString& encryptedData, ByteString& data)
{
	if (!SymmetricAlgorithm::decryptUpdate(encryptedData, data))
	{
		clean();
		return false;
	}

	// AEAD ciphers should not return decrypted data until final is called
	if (currentCipherMode == SymMode::GCM)
	{
		data.resize(0);
		return true;
	}

	// Count number of bytes written
	if (maximumBytes)
	{
		BN_add_word(counterBytes, encryptedData.size());
	}

	// Prepare the output block
	data.resize(encryptedData.size() + getBlockSize());

	int outLen = data.size();

	DEBUG_MSG("Decrypting %d bytes into buffer of %d bytes", encryptedData.size(), data.size());

	if (!EVP_DecryptUpdate(pCurCTX, &data[0], &outLen, (unsigned char*) encryptedData.const_byte_str(), encryptedData.size()))
	{
		ERROR_MSG("EVP_DecryptUpdate failed: %s", ERR_error_string(ERR_get_error(), NULL));

		clean();

		ByteString dummy;
		SymmetricAlgorithm::decryptFinal(dummy);

		return false;
	}

	DEBUG_MSG("Decrypt returned %d bytes of data", outLen);

	// Resize the output block
	data.resize(outLen);
	currentBufferSize -= outLen;

	return true;
}